

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O0

bool __thiscall cmStdIoConnection::OnConnectionShuttingDown(cmStdIoConnection *this)

{
  cmStdIoConnection *this_local;
  
  if ((this->super_cmEventBasedConnection).ReadStream != (uv_stream_t *)0x0) {
    uv_read_stop((this->super_cmEventBasedConnection).ReadStream);
  }
  ShutdownStream(this,&(this->super_cmEventBasedConnection).ReadStream);
  ShutdownStream(this,&(this->super_cmEventBasedConnection).WriteStream);
  cmEventBasedConnection::OnConnectionShuttingDown(&this->super_cmEventBasedConnection);
  return true;
}

Assistant:

bool cmStdIoConnection::OnConnectionShuttingDown()
{
  if (ReadStream) {
    uv_read_stop(ReadStream);
  }

  ShutdownStream(ReadStream);
  ShutdownStream(WriteStream);

  cmEventBasedConnection::OnConnectionShuttingDown();

  return true;
}